

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::getParent
          (Maybe<capnp::compiler::Resolver::ResolvedDecl> *__return_storage_ptr__,Node *this)

{
  anon_class_1_0_00000001 local_19;
  Node *local_18;
  Node *this_local;
  
  local_18 = this;
  this_local = (Node *)__return_storage_ptr__;
  kj::Maybe<capnp::compiler::Compiler::Node_&>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:932:21)>
            (__return_storage_ptr__,&this->parent,&local_19);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolvedDecl> Compiler::Node::getParent() {
  return parent.map([](Node& parent) {
    uint64_t scopeId = parent.parent.map([](Node& gp) { return gp.id; }).orDefault(0);
    return ResolvedDecl { parent.id, parent.genericParamCount, scopeId, parent.kind, &parent, kj::none };
  });
}